

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.h
# Opt level: O1

size_t __thiscall std::hash<luna::Value>::operator()(hash<luna::Value> *this,Value *t)

{
  size_t sVar1;
  undefined8 uStack_8;
  
  uStack_8 = (GCObject *)(ulong)t->type_;
  switch(uStack_8) {
  case (GCObject *)0x0:
    break;
  case (GCObject *)0x1:
    return (ulong)(t->field_0).bvalue_;
  case (GCObject *)0x2:
    sVar1 = hash<double>::operator()((hash<double> *)((long)&uStack_8 + 7),(t->field_0).num_);
    return sVar1;
  default:
    uStack_8 = (t->field_0).obj_;
  }
  return (size_t)uStack_8;
}

Assistant:

size_t operator () (const luna::Value &t) const
        {
            switch (t.type_)
            {
                case luna::ValueT_Nil:
                    return hash<int>()(0);
                case luna::ValueT_Bool:
                    return hash<bool>()(t.bvalue_);
                case luna::ValueT_Number:
                    return hash<double>()(t.num_);
                case luna::ValueT_String:
                    return hash<void *>()(t.str_);
                case luna::ValueT_Closure:
                    return hash<void *>()(t.closure_);
                case luna::ValueT_Upvalue:
                    return hash<void *>()(t.upvalue_);
                case luna::ValueT_Table:
                    return hash<void *>()(t.table_);
                case luna::ValueT_UserData:
                    return hash<void *>()(t.user_data_);
                case luna::ValueT_CFunction:
                    return hash<void *>()(reinterpret_cast<void *>(t.cfunc_));
                default:
                    return hash<void *>()(t.obj_);
            }
        }